

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O3

float mraa_pwm_read(mraa_pwm_context dev)

{
  _func_float_mraa_pwm_context *p_Var1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  char *pcVar8;
  char *__fmt;
  float fVar9;
  char output [64];
  char *local_70;
  char local_68 [72];
  
  if (dev == (mraa_pwm_context)0x0) {
    syslog(3,"pwm: read: context is NULL");
    return 5.0;
  }
  iVar2 = mraa_pwm_read_period(dev);
  if (iVar2 < 1) {
    return 0.0;
  }
  if ((dev->advance_func != (mraa_adv_func_t *)0x0) &&
     (p_Var1 = dev->advance_func->pwm_read_replace, p_Var1 != (_func_float_mraa_pwm_context *)0x0))
  {
    fVar9 = (*p_Var1)(dev);
    uVar5 = (ulong)(uint)(int)fVar9;
    goto LAB_0010e37a;
  }
  if (dev->duty_fp == -1) {
    iVar3 = mraa_pwm_setup_duty_fp(dev);
    if (iVar3 == 0) goto LAB_0010e2bb;
    uVar7 = dev->pin;
    piVar6 = __errno_location();
    pcVar8 = strerror(*piVar6);
    __fmt = "pwm%i read_duty: Failed to open duty_cycle for reading: %s";
LAB_0010e34c:
    syslog(3,__fmt,(ulong)uVar7,pcVar8);
  }
  else {
    lseek(dev->duty_fp,0,0);
LAB_0010e2bb:
    sVar4 = read(dev->duty_fp,local_68,0x40);
    if (sVar4 < 0) {
      uVar7 = dev->pin;
      piVar6 = __errno_location();
      pcVar8 = strerror(*piVar6);
      __fmt = "pwm%i read_duty: Failed to read duty_cycle: %s";
      goto LAB_0010e34c;
    }
    uVar5 = strtol(local_68,&local_70,10);
    if ((*local_70 == '\0') || (*local_70 == '\n')) {
      if ((long)(int)uVar5 == uVar5) goto LAB_0010e37a;
      uVar7 = dev->pin;
      pcVar8 = "pwm%i read_duty: Number is invalid";
    }
    else {
      uVar7 = dev->pin;
      pcVar8 = "pwm%i read_duty: Error in string conversion";
    }
    syslog(3,pcVar8,(ulong)uVar7);
  }
  uVar5 = 0xffffffff;
LAB_0010e37a:
  return (float)(int)uVar5 / (float)iVar2;
}

Assistant:

float
mraa_pwm_read(mraa_pwm_context dev)
{
    if (!dev) {
        syslog(LOG_ERR, "pwm: read: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    int period = mraa_pwm_read_period(dev);
    if (period > 0) {
        return (mraa_pwm_read_duty(dev) / (float) period);
    }
    return 0.0f;
}